

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

bool __thiscall
libchars::command_cursor::command(command_cursor *this,filter_t mask,bool ignore_hidden)

{
  bool bVar1;
  command_node *pcVar2;
  byte local_29;
  byte local_1a;
  bool ignore_hidden_local;
  filter_t mask_local;
  command_cursor *this_local;
  
  bVar1 = valid(this);
  local_1a = 0;
  if (bVar1) {
    pcVar2 = current(this);
    local_1a = 0;
    if (((pcVar2->mask & mask) != 0) &&
       ((pcVar2 = current(this), (pcVar2->hidden & 1U) == 0 || (local_1a = 0, ignore_hidden)))) {
      pcVar2 = current(this);
      local_1a = 0;
      if (pcVar2->cmd != (command *)0x0) {
        pcVar2 = current(this);
        local_1a = 0;
        if ((pcVar2->cmd->mask & mask) != 0) {
          pcVar2 = current(this);
          local_29 = 1;
          if ((pcVar2->cmd->hidden & 1U) != 0) {
            local_29 = ignore_hidden;
          }
          local_1a = local_29;
        }
      }
    }
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool command_cursor::command(command::filter_t mask, bool ignore_hidden) const
    {
        return valid() &&
               (current()->mask & mask) != 0 &&
               (!current()->hidden || ignore_hidden) &&
               current()->cmd != NULL &&
               (current()->cmd->mask & mask) != 0 &&
               (!current()->cmd->hidden || ignore_hidden);
    }